

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNConst::gen_code_member
          (CTPNConst *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  tc_constval_type_t tVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  CTcNamedArgs *in_RDI;
  int in_R9D;
  undefined8 in_stack_00000008;
  uchar in_stack_0000009f;
  CTcGenTarg *in_stack_000000a0;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  
  iVar2 = (int)((ulong)in_RDX >> 0x20);
  tVar1 = CTcConstVal::get_type((CTcConstVal *)&in_RDI->args);
  if (2 < tVar1 - TC_CVT_SSTR) {
    if (tVar1 == TC_CVT_OBJ) {
      CTcConstVal::get_val_obj((CTcConstVal *)&in_RDI->args);
      CTcSymObj::s_gen_code_member
                (iVar2,(CTcPrsNode *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                 (vm_obj_id_t)((ulong)in_stack_00000008 >> 0x20),(int)in_stack_00000008,in_RDI);
      return;
    }
    if (tVar1 != TC_CVT_FLOAT) {
      CTcTokenizer::log_error(0x2cff);
      return;
    }
  }
  (*(code *)**(undefined8 **)in_RDI)(in_RDI,0);
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  if (in_R9D != 0) {
    CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
  }
  CTcPrsNode::s_gen_member_rhs
            (iVar2,(CTcPrsNode *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc,
             (CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void CTPNConst::gen_code_member(int discard,
                                CTcPrsNode *prop_expr, int prop_is_expr,
                                int argc, int varargs, CTcNamedArgs *named_args)
{
    /* check our constant type */
    switch(val_.get_type())
    {
    case TC_CVT_OBJ:
        /* call the object symbol code to do the work */
        CTcSymObj::s_gen_code_member(discard, prop_expr, prop_is_expr,
                                     argc, val_.get_val_obj(),
                                     varargs, named_args);
        break;

    case TC_CVT_LIST:
    case TC_CVT_SSTR:
    case TC_CVT_RESTR:
    case TC_CVT_FLOAT:
        /* 
         *   list/string/BigNumber constant - generate our value as
         *   normal, then use the standard member generation 
         */
        gen_code(FALSE, FALSE);

        /* if we have an argument counter, put it back on top */
        if (varargs)
            G_cg->write_op(OPC_SWAP);

        /* use standard member generation */
        CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                     argc, varargs, named_args);
        break;

    default:
        G_tok->log_error(TCERR_INVAL_OBJ_EXPR);
        break;
    }
}